

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

AssertionResult __thiscall
testing::internal::
CmpHelperEQFailure<Deque<int,std::allocator<int>>::DequeIterator<int_const,int_const&,int_const*,Deque<int,std::allocator<int>>const>,Deque<int,std::allocator<int>>::DequeIterator<int_const,int_const&,int_const*,Deque<int,std::allocator<int>>const>>
          (internal *this,char *lhs_expression,char *rhs_expression,
          DequeIterator<const_int,_const_int_&,_const_int_*,_const_Deque<int,_std::allocator<int>_>_>
          *lhs,DequeIterator<const_int,_const_int_&,_const_int_*,_const_Deque<int,_std::allocator<int>_>_>
               *rhs)

{
  DequeIterator<const_int,_const_int_&,_const_int_*,_const_Deque<int,_std::allocator<int>_>_> *value
  ;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  AssertionResult AVar1;
  string local_60;
  string local_40;
  
  PrintToString<Deque<int,std::allocator<int>>::DequeIterator<int_const,int_const&,int_const*,Deque<int,std::allocator<int>>const>>
            (&local_40,(testing *)lhs,
             (DequeIterator<const_int,_const_int_&,_const_int_*,_const_Deque<int,_std::allocator<int>_>_>
              *)rhs_expression);
  PrintToString<Deque<int,std::allocator<int>>::DequeIterator<int_const,int_const&,int_const*,Deque<int,std::allocator<int>>const>>
            (&local_60,(testing *)rhs,value);
  EqFailure(this,lhs_expression,rhs_expression,&local_40,&local_60,false);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  AVar1.message_.ptr_ = extraout_RDX.ptr_;
  AVar1._0_8_ = this;
  return AVar1;
}

Assistant:

AssertionResult CmpHelperEQFailure(const char* lhs_expression,
                                   const char* rhs_expression,
                                   const T1& lhs, const T2& rhs) {
  return EqFailure(lhs_expression,
                   rhs_expression,
                   FormatForComparisonFailureMessage(lhs, rhs),
                   FormatForComparisonFailureMessage(rhs, lhs),
                   false);
}